

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
StringToBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             string *str)

{
  allocator<unsigned_char> local_49;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [8];
  string s;
  string *str_local;
  
  s.field_2._8_8_ = str;
  std::__cxx11::string::string((string *)local_38,str);
  local_40._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_48._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  std::allocator<unsigned_char>::allocator(&local_49);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,local_40,
             local_48,&local_49);
  std::allocator<unsigned_char>::~allocator(&local_49);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> StringToBytes(const std::string& str) {
    
    std::string s(str);
    return std::vector<uint8_t> (s.begin(), s.end());
}